

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

void __thiscall
dxil_spv::CFGStructurizer::rewrite_transposed_loop_inner
          (CFGStructurizer *this,CFGNode *node,CFGNode *impossible_merge_target,
          LoopMergeAnalysis *analysis)

{
  CFGNode *false_block;
  CFGNode *true_block;
  bool bVar1;
  CFGNode *this_00;
  reference ppCVar2;
  ThreadLocalAllocator<char> local_129;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_108;
  anon_class_8_1_546a8613 local_e8;
  function<bool_(const_dxil_spv::CFGNode_*)> local_e0;
  CFGNode *local_c0;
  CFGNode *ladder_pred;
  iterator __end1;
  iterator __begin1;
  Vector<CFGNode_*> *__range1;
  Vector<CFGNode_*> ladder_preds;
  CFGNode *ladder_selection;
  CFGNode *local_40;
  CFGNode *ladder_break;
  CFGNode *dominated_merge;
  CFGNode *merge;
  LoopMergeAnalysis *analysis_local;
  CFGNode *impossible_merge_target_local;
  CFGNode *node_local;
  CFGStructurizer *this_local;
  
  dominated_merge = analysis->merge;
  ladder_break = analysis->dominated_merge;
  merge = (CFGNode *)analysis;
  analysis_local = (LoopMergeAnalysis *)impossible_merge_target;
  impossible_merge_target_local = node;
  node_local = (CFGNode *)this;
  local_40 = CFGNodePool::create_node(this->pool);
  std::operator+((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)&ladder_selection,&impossible_merge_target_local->name,
                 ".transposed-merge-inner.break");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  operator=(&local_40->name,
            (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
            &ladder_selection);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  ~basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *
                )&ladder_selection);
  (local_40->ir).terminator.type = Branch;
  (local_40->ir).terminator.direct_block = (CFGNode *)analysis_local;
  local_40->immediate_post_dominator = (CFGNode *)analysis_local;
  local_40->forward_post_visit_order = *(uint32_t *)&analysis_local[8].dominated_merge;
  local_40->backward_post_visit_order = *(uint32_t *)((long)&analysis_local[8].dominated_merge + 4);
  this_00 = CFGNodePool::create_node(this->pool);
  std::operator+((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)&ladder_preds.
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 &impossible_merge_target_local->name,".transposed-merge-inner");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  operator=(&this_00->name,
            (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
            &ladder_preds.
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  ~basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *
                )&ladder_preds.
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00->forward_post_visit_order = *(uint32_t *)&analysis_local[8].dominated_merge;
  this_00->backward_post_visit_order = *(uint32_t *)((long)&analysis_local[8].dominated_merge + 4);
  this_00->immediate_post_dominator = dominated_merge;
  local_40->immediate_dominator = this_00;
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
            ((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
             &__range1,&ladder_break->pred);
  CFGNode::add_branch(this_00,local_40);
  CFGNode::add_branch(this_00,ladder_break);
  traverse_dominated_blocks_and_rewrite_branch
            (this,impossible_merge_target_local,(CFGNode *)analysis_local,this_00);
  CFGNode::recompute_immediate_dominator(this_00);
  CFGNode::add_branch(local_40,(CFGNode *)analysis_local);
  __end1 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
           begin((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  *)&__range1);
  ladder_pred = (CFGNode *)
                std::
                vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                end((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     *)&__range1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                *)&ladder_pred);
    true_block = ladder_break;
    false_block = local_40;
    if (!bVar1) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
              ::operator*(&__end1);
    local_c0 = *ppCVar2;
    CFGNode::retarget_branch(local_c0,ladder_break,this_00);
    __gnu_cxx::
    __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
    ::operator++(&__end1);
  }
  local_e8.ladder_preds = (Vector<CFGNode_*> *)&__range1;
  std::function<bool(dxil_spv::CFGNode_const*)>::
  function<dxil_spv::CFGStructurizer::rewrite_transposed_loop_inner(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGStructurizer::LoopMergeAnalysis_const&)::__0,void>
            ((function<bool(dxil_spv::CFGNode_const*)> *)&local_e0,&local_e8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  basic_string(&local_128,"transposed_selector_",&local_129);
  std::operator+(&local_108,&local_128,&impossible_merge_target_local->name);
  rewrite_ladder_conditional_branch_from_incoming_blocks
            (this,this_00,true_block,false_block,&local_e0,&local_108);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  ~basic_string(&local_108);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  ~basic_string(&local_128);
  std::function<bool_(const_dxil_spv::CFGNode_*)>::~function(&local_e0);
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::~vector
            ((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
             &__range1);
  return;
}

Assistant:

void CFGStructurizer::rewrite_transposed_loop_inner(CFGNode *node, CFGNode *impossible_merge_target,
                                                    const LoopMergeAnalysis &analysis)
{
	// Rewrite the control flow from the inside out through a transposition.
	// The common break target will become the merge block instead.
	// The continue will break out to the transposed merge instead.
	// In the ladder, we will enter a breaking path which branches out to loop_ladder.

	// We just arbitrary call this "inner", since I don't think it has a formal name.
	// In this case, dominated merge cannot reach impossible merge target.

	auto *merge = analysis.merge;
	auto *dominated_merge = analysis.dominated_merge;

	auto *ladder_break = pool.create_node();
	ladder_break->name = node->name + ".transposed-merge-inner.break";
	ladder_break->ir.terminator.type = Terminator::Type::Branch;
	ladder_break->ir.terminator.direct_block = impossible_merge_target;
	ladder_break->immediate_post_dominator = impossible_merge_target;
	ladder_break->forward_post_visit_order = impossible_merge_target->forward_post_visit_order;
	ladder_break->backward_post_visit_order = impossible_merge_target->backward_post_visit_order;

	auto *ladder_selection = pool.create_node();
	ladder_selection->name = node->name + ".transposed-merge-inner";
	ladder_selection->forward_post_visit_order = impossible_merge_target->forward_post_visit_order;
	ladder_selection->backward_post_visit_order = impossible_merge_target->backward_post_visit_order;
	ladder_selection->immediate_post_dominator = merge;
	ladder_break->immediate_dominator = ladder_selection;

	auto ladder_preds = dominated_merge->pred;

	ladder_selection->add_branch(ladder_break);
	ladder_selection->add_branch(dominated_merge);
	traverse_dominated_blocks_and_rewrite_branch(node, impossible_merge_target, ladder_selection);
	ladder_selection->recompute_immediate_dominator();

	ladder_break->add_branch(impossible_merge_target);

	// Branches from these blocks should be rewritten to target transposed-merge.
	for (auto *ladder_pred : ladder_preds)
		ladder_pred->retarget_branch(dominated_merge, ladder_selection);

	rewrite_ladder_conditional_branch_from_incoming_blocks(
		ladder_selection,
		dominated_merge, ladder_break,
		[&](const CFGNode *n) { return std::find(ladder_preds.begin(), ladder_preds.end(), n) != ladder_preds.end(); },
		String("transposed_selector_") + node->name);
}